

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFile.cpp
# Opt level: O2

bool __thiscall asl::TextFile::append(TextFile *this,String *s)

{
  int iVar1;
  size_t sVar2;
  FILE *__s;
  int in_EDX;
  anon_union_16_2_78e7fdac_for_String_2 *__ptr;
  
  __s = (FILE *)(this->super_File)._file;
  if (__s == (FILE *)0x0) {
    iVar1 = open(this,(char *)0x2,in_EDX);
    if ((char)iVar1 == '\0') {
      return false;
    }
    __s = (FILE *)(this->super_File)._file;
  }
  if (s->_size == 0) {
    __ptr = &s->field_2;
  }
  else {
    __ptr = (anon_union_16_2_78e7fdac_for_String_2 *)(s->field_2)._str;
  }
  sVar2 = fwrite(__ptr,1,(long)s->_len,__s);
  return s->_len <= (int)sVar2;
}

Assistant:

bool TextFile::append(const String& s)
{
	if (!_file && !open(APPEND))
		return false;
	return (int)fwrite(*s, 1, s.length(), _file) >= s.length();
}